

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_msg.h
# Opt level: O0

void __thiscall
nodecpp::platform::internal_msg::InternalMsg::append(InternalMsg *this,void *buff_,size_t sz)

{
  uint8_t *puVar1;
  size_t sVar2;
  EVP_PKEY_CTX *pEVar3;
  anon_class_8_1_8991fb9c local_50;
  anon_class_8_1_8991fb9c local_48;
  uint8_t *local_40;
  size_t remainingInPage;
  anon_class_8_1_8991fb9c local_30;
  uint8_t *local_28;
  uint8_t *buff;
  size_t sz_local;
  void *buff__local;
  InternalMsg *this_local;
  
  local_28 = (uint8_t *)buff_;
  buff = (uint8_t *)sz;
  sz_local = (size_t)buff_;
  buff__local = this;
  while( true ) {
    if (buff == (uint8_t *)0x0) {
      return;
    }
    puVar1 = PagePtrWrapper::page(&this->currentPage);
    if (puVar1 == (uint8_t *)0x0) {
      if (this->totalSz == 0) {
        local_30.this = this;
        assert::
        nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)2,nodecpp::platform::internal_msg::InternalMsg::append(void_const*,unsigned_long)::_lambda()_1_>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/include/internal_msg.h"
                   ,0x1ef,&local_30,"currentPage.page() == nullptr");
        reserveSpaceForConvertionToTag(this);
      }
      else {
        implAddPage(this);
      }
      remainingInPage = (size_t)this;
      assert::
      nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)2,nodecpp::platform::internal_msg::InternalMsg::append(void_const*,unsigned_long)::_lambda()_2_>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/include/internal_msg.h"
                 ,0x1f2,(anon_class_8_1_8991fb9c *)&remainingInPage,"currentPage.page() != nullptr")
      ;
    }
    local_40 = (uint8_t *)remainingSizeInCurrentPage(this);
    if (buff <= local_40) break;
    puVar1 = PagePtrWrapper::page(&this->currentPage);
    sVar2 = offsetInCurrentPage(this);
    memcpy(puVar1 + sVar2,local_28,(size_t)local_40);
    buff = buff + -(long)local_40;
    local_28 = local_40 + (long)local_28;
    this->totalSz = (size_t)(local_40 + this->totalSz);
    pEVar3 = (EVP_PKEY_CTX *)0x206;
    local_50.this = this;
    assert::
    nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)2,nodecpp::platform::internal_msg::InternalMsg::append(void_const*,unsigned_long)::_lambda()_4_>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/include/internal_msg.h"
               ,0x206,&local_50,"offsetInCurrentPage() == 0");
    PagePtrWrapper::init(&this->currentPage,pEVar3);
  }
  puVar1 = PagePtrWrapper::page(&this->currentPage);
  sVar2 = offsetInCurrentPage(this);
  memcpy(puVar1 + sVar2,local_28,(size_t)buff);
  this->totalSz = (size_t)(buff + this->totalSz);
  if (buff != local_40) {
    return;
  }
  pEVar3 = (EVP_PKEY_CTX *)0x1fb;
  local_48.this = this;
  assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)2,nodecpp::platform::internal_msg::InternalMsg::append(void_const*,unsigned_long)::_lambda()_3_>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/include/internal_msg.h"
             ,0x1fb,&local_48,"offsetInCurrentPage() == 0");
  PagePtrWrapper::init(&this->currentPage,pEVar3);
  return;
}

Assistant:

void append( const void* buff_, size_t sz )
		{
			const uint8_t* buff = reinterpret_cast<const uint8_t*>(buff_);
			while( sz != 0 )
			{
				if ( currentPage.page() == nullptr )
				{
					if ( totalSz )
						implAddPage();
					else
					{
						NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, currentPage.page() == nullptr );
						reserveSpaceForConvertionToTag();
					}
					NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, currentPage.page() != nullptr );
				}
				size_t remainingInPage = remainingSizeInCurrentPage();
				if ( sz <= remainingInPage )
				{
					memcpy( currentPage.page() + offsetInCurrentPage(), buff, sz );
					totalSz += sz;
					if( sz == remainingInPage )
					{
						NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, offsetInCurrentPage() == 0 );
						currentPage.init();
					}
					break;
				}
				else
				{
					memcpy( currentPage.page() + offsetInCurrentPage(), buff, remainingInPage );
					sz -= remainingInPage;
					buff += remainingInPage;
					totalSz += remainingInPage;
					NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, offsetInCurrentPage() == 0 );
					currentPage.init();
				}
			}
		}